

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

void __thiscall Entity::setRotation(Entity *this,float rotation)

{
  float local_18;
  float actualRotation;
  float rotation_local;
  Entity *this_local;
  
  for (local_18 = rotation; 270.0 < local_18; local_18 = local_18 - 360.0) {
  }
  for (; local_18 < 0.0; local_18 = local_18 + 360.0) {
  }
  this->rotation = (int)local_18;
  return;
}

Assistant:

void Entity::setRotation(float rotation) {
    float actualRotation = rotation;
    while (actualRotation > 270) {
        actualRotation -= 360;
    }
    while (actualRotation < 0) {
        actualRotation += 360;
    }
    this->rotation = actualRotation;
}